

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O2

int Set2ActuatorsRoboteq(ROBOTEQ *pRoboteq,double u_1,double u_2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 local_18;
  undefined4 local_10;
  int local_c [3];
  
  local_c[2] = 0;
  local_10 = 0;
  uVar2 = (uint)(u_1 * 1000.0 * 0.5);
  uVar3 = (uint)(u_2 * 1000.0 * 0.5);
  uVar4 = -(uint)((int)uVar2 < 500);
  uVar5 = -(uint)((int)uVar3 < 500);
  uVar4 = ~uVar4 & 500 | uVar2 & uVar4;
  uVar5 = ~uVar5 & 500 | uVar3 & uVar5;
  uVar2 = -(uint)(-500 < (int)uVar4);
  uVar3 = -(uint)(-500 < (int)uVar5);
  local_18 = CONCAT44((~uVar3 & 0xfffffe0c | uVar5 & uVar3) + 0x5dc,
                      (~uVar2 & 0xfffffe0c | uVar4 & uVar2) + 0x5dc);
  local_c[0] = 1;
  local_c[1] = 1;
  iVar1 = SetAllPWMsRoboteq(pRoboteq,local_c,(int *)&local_18);
  return iVar1;
}

Assistant:

inline int Set2ActuatorsRoboteq(ROBOTEQ* pRoboteq, double u_1, double u_2)
{
	int selectedchannels[NB_CHANNELS_PWM_ROBOTEQ];
	int pws[NB_CHANNELS_PWM_ROBOTEQ];

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert u (in [-1;1]) into Roboteq pulse width (in us).
	pws[0] = DEFAULT_MID_PW_ROBOTEQ+(int)(u_1*(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MIN_PW_ROBOTEQ)/2.0);
	pws[1] = DEFAULT_MID_PW_ROBOTEQ+(int)(u_2*(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MIN_PW_ROBOTEQ)/2.0);

	pws[0] = max(min(pws[0], DEFAULT_MAX_PW_ROBOTEQ), DEFAULT_MIN_PW_ROBOTEQ);
	pws[1] = max(min(pws[1], DEFAULT_MAX_PW_ROBOTEQ), DEFAULT_MIN_PW_ROBOTEQ);

	selectedchannels[0] = 1;
	selectedchannels[1] = 1;

	return SetAllPWMsRoboteq(pRoboteq, selectedchannels, pws);
}